

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

TLetter Cipher::decode(TClusters *t,int idx,TClusterToLetterMap *clMap,THint *hint)

{
  int iVar1;
  pointer piVar2;
  int iVar3;
  mapped_type *pmVar4;
  
  pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     (clMap,(t->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start + idx);
  piVar2 = (hint->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar3 = *pmVar4;
  if ((idx < (int)((ulong)((long)(hint->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar2) >> 2)) &&
     (iVar1 = piVar2[idx], iVar1 != -1)) {
    iVar3 = iVar1;
  }
  return iVar3;
}

Assistant:

TLetter decode(const TClusters & t, int idx, const TClusterToLetterMap & clMap, const THint & hint) {
        const auto & cid = t[idx];
        auto let = clMap.at(cid);
        if ((int) hint.size() > idx && hint[idx] != -1) {
            let = hint[idx];
        }

        return let;
    }